

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvref_common.c
# Opt level: O0

void process_compound_ref_mv_candidate
               (MB_MODE_INFO *candidate,AV1_COMMON *cm,MV_REFERENCE_FRAME *rf,int_mv (*ref_id) [2],
               int *ref_id_count,int_mv (*ref_diff) [2],int *ref_diff_count)

{
  char cVar1;
  int_mv this_mv;
  int cmp_idx;
  MV_REFERENCE_FRAME can_rf;
  int rf_idx;
  int_mv (*ref_diff_local) [2];
  int *ref_id_count_local;
  int_mv (*ref_id_local) [2];
  MV_REFERENCE_FRAME *rf_local;
  AV1_COMMON *cm_local;
  MB_MODE_INFO *candidate_local;
  
  for (rf_idx = 0; rf_idx < 2; rf_idx = rf_idx + 1) {
    cVar1 = candidate->ref_frame[rf_idx];
    for (cmp_idx = 0; cmp_idx < 2; cmp_idx = cmp_idx + 1) {
      if ((cVar1 == rf[cmp_idx]) && (ref_id_count[cmp_idx] < 2)) {
        ref_id[cmp_idx][ref_id_count[cmp_idx]] = candidate->mv[rf_idx];
        ref_id_count[cmp_idx] = ref_id_count[cmp_idx] + 1;
      }
      else if (('\0' < cVar1) && (ref_diff_count[cmp_idx] < 2)) {
        this_mv = (int_mv)*(int_mv *)&candidate->mv[rf_idx].as_mv;
        if (cm->ref_frame_sign_bias[cVar1] != cm->ref_frame_sign_bias[rf[cmp_idx]]) {
          this_mv.as_mv.col = -this_mv.as_mv.col;
          this_mv.as_mv.row = -this_mv.as_mv.row;
        }
        ref_diff[cmp_idx][ref_diff_count[cmp_idx]] = this_mv;
        ref_diff_count[cmp_idx] = ref_diff_count[cmp_idx] + 1;
      }
    }
  }
  return;
}

Assistant:

static inline void process_compound_ref_mv_candidate(
    const MB_MODE_INFO *const candidate, const AV1_COMMON *const cm,
    const MV_REFERENCE_FRAME *const rf, int_mv ref_id[2][2],
    int ref_id_count[2], int_mv ref_diff[2][2], int ref_diff_count[2]) {
  for (int rf_idx = 0; rf_idx < 2; ++rf_idx) {
    MV_REFERENCE_FRAME can_rf = candidate->ref_frame[rf_idx];

    for (int cmp_idx = 0; cmp_idx < 2; ++cmp_idx) {
      if (can_rf == rf[cmp_idx] && ref_id_count[cmp_idx] < 2) {
        ref_id[cmp_idx][ref_id_count[cmp_idx]] = candidate->mv[rf_idx];
        ++ref_id_count[cmp_idx];
      } else if (can_rf > INTRA_FRAME && ref_diff_count[cmp_idx] < 2) {
        int_mv this_mv = candidate->mv[rf_idx];
        if (cm->ref_frame_sign_bias[can_rf] !=
            cm->ref_frame_sign_bias[rf[cmp_idx]]) {
          this_mv.as_mv.row = -this_mv.as_mv.row;
          this_mv.as_mv.col = -this_mv.as_mv.col;
        }
        ref_diff[cmp_idx][ref_diff_count[cmp_idx]] = this_mv;
        ++ref_diff_count[cmp_idx];
      }
    }
  }
}